

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

void fct_nlist__append(fct_nlist_t *list,void *itm)

{
  size_t sVar1;
  void **ppvVar2;
  
  if (list == (fct_nlist_t *)0x0) {
    __assert_fail("list != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x32a
                  ,"void fct_nlist__append(fct_nlist_t *, void *)");
  }
  sVar1 = list->avail_itm_num;
  if (list->used_itm_num == sVar1) {
    list->avail_itm_num = sVar1 * 2 + 2;
    ppvVar2 = (void **)realloc(list->itm_list,sVar1 * 0x10 + 0x10);
    list->itm_list = ppvVar2;
    if (ppvVar2 == (void **)0x0) {
      __assert_fail("list->itm_list != ((void*)0) && \"memory check\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x337,"void fct_nlist__append(fct_nlist_t *, void *)");
    }
  }
  sVar1 = list->used_itm_num;
  list->itm_list[sVar1] = itm;
  list->used_itm_num = sVar1 + 1;
  return;
}

Assistant:

static void
fct_nlist__append(fct_nlist_t *list, void *itm)
{
    FCT_ASSERT( list != NULL );
    /* If we ran out of room, then the last increment should be equal to the
    available space, in this case we need to grow a little more. If this
    list started as size 0, then we should encounter the same effect as
    "running out of room." */
    if ( list->used_itm_num == list->avail_itm_num )
    {
        /* Use multiple and add, since the avail_itm_num could be 0. */
        list->avail_itm_num = list->avail_itm_num*FCT_LIST_GROWTH_FACTOR+\
                              FCT_LIST_GROWTH_FACTOR;
        list->itm_list = (void**)realloc(
                             list->itm_list, sizeof(void*)*list->avail_itm_num
                         );
        FCT_ASSERT( list->itm_list != NULL && "memory check");
    }

    list->itm_list[list->used_itm_num] = itm;
    ++(list->used_itm_num);
}